

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O2

void spell_message(monster_conflict *mon,monster_spell *spell,_Bool seen,_Bool hits)

{
  byte bVar1;
  monster_spell_level *pmVar2;
  monster_race *pmVar3;
  int iVar4;
  monster_spell_level *pmVar5;
  char *pcVar6;
  char *pcVar7;
  ushort **ppuVar8;
  wchar_t mode;
  monster_conflict *pmVar9;
  char *desc;
  wchar_t wVar10;
  monster_conflict *local_4a8;
  size_t end;
  char punct [8];
  char m_name [80];
  char buf [1024];
  
  builtin_strncpy(punct,".!?;:,\'",8);
  memset(buf,0,0x400);
  end = 0;
  pmVar2 = spell->level;
  do {
    pmVar5 = pmVar2;
    pmVar2 = pmVar5->next;
    if (pmVar2 == (monster_spell_level *)0x0) break;
  } while (pmVar2->power <= mon->race->spell_power);
  wVar10 = (mon->target).midx;
  if (wVar10 < L'\x01') {
    if (seen) {
      local_4a8 = (monster_conflict *)0x0;
      goto LAB_0017c9b1;
    }
  }
  else {
    local_4a8 = (monster_conflict *)cave_monster(cave,wVar10);
    if (seen) {
LAB_0017c9b1:
      pmVar3 = mon->race;
      wVar10 = (wchar_t)spell->index;
      if (hits) {
        pcVar6 = find_alternate_spell_message(pmVar3,wVar10,MON_ALTMSG_SEEN);
        if (pcVar6 == (char *)0x0) {
          pcVar6 = pmVar5->message;
          if (pcVar6 != (char *)0x0) goto LAB_0017ca5d;
          pcVar6 = pmVar3->name;
          pcVar7 = "No message-vis for monster spell %d cast by %s.  Please report this bug.";
          goto LAB_0017cd49;
        }
      }
      else {
        pcVar6 = find_alternate_spell_message(pmVar3,wVar10,MON_ALTMSG_MISS);
        if (pcVar6 == (char *)0x0) {
          pcVar6 = pmVar5->miss_message;
          if (pcVar6 == (char *)0x0) {
            pcVar6 = pmVar3->name;
            pcVar7 = "No message-miss for monster spell %d cast by %s.  Please report this bug.";
            goto LAB_0017cd49;
          }
          goto LAB_0017ca5d;
        }
      }
      if (*pcVar6 == '\0') {
        return;
      }
      goto LAB_0017ca5d;
    }
    if (local_4a8 != (monster_conflict *)0x0) {
      return;
    }
  }
  pmVar3 = mon->race;
  wVar10 = (wchar_t)spell->index;
  pcVar6 = find_alternate_spell_message(pmVar3,wVar10,MON_ALTMSG_UNSEEN);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = pmVar5->blind_message;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = pmVar3->name;
      pcVar7 = "No message-invis for monster spell %d cast by %s.  Please report this bug.";
LAB_0017cd49:
      msg(pcVar7,(ulong)(uint)wVar10,pcVar6);
      return;
    }
  }
  else if (*pcVar6 == '\0') {
    return;
  }
  local_4a8 = (monster_conflict *)0x0;
LAB_0017ca5d:
  pcVar7 = strchr(pcVar6,0x7b);
  wVar10 = (uint)(pcVar7 == pcVar6) << 8 | 0x14;
  do {
    if (pcVar7 == (char *)0x0) {
      strnfcat(buf,0x400,&end,"%s",pcVar6);
      msgt(spell->msgt,"%s",buf);
      return;
    }
    strnfcat(buf,0x400,&end,"%.*s",(ulong)(uint)((int)pcVar7 - (int)pcVar6),pcVar6);
    pcVar6 = pcVar7 + 1;
    pcVar7 = pcVar7 + 2;
    while( true ) {
      bVar1 = pcVar7[-1];
      if ((ulong)bVar1 == 0) break;
      ppuVar8 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1) & 4) == 0) {
        if (bVar1 != 0x7d) break;
        iVar4 = strncmp(pcVar6,"name",4);
        pmVar9 = mon;
        if (iVar4 == 0) {
          pcVar6 = strchr(punct,(int)*pcVar7);
          mode = wVar10 | 0x200;
          if (pcVar6 != (char *)0x0) {
            mode = wVar10;
          }
LAB_0017cc51:
          desc = m_name;
          monster_desc(desc,0x50,(monster *)pmVar9,mode);
        }
        else {
          iVar4 = strncmp(pcVar6,"pronoun",7);
          if (iVar4 == 0) {
            mode = L'\"';
            goto LAB_0017cc51;
          }
          iVar4 = strncmp(pcVar6,"target",6);
          if (iVar4 == 0) {
            if (L'\0' < (mon->target).midx) {
              pcVar6 = strchr(punct,(int)*pcVar7);
              pmVar9 = local_4a8;
              mode = (uint)(pcVar6 == (char *)0x0) << 9 | 0x15;
              goto LAB_0017cc51;
            }
            strnfcat(buf,0x400,&end,"you");
            pcVar6 = pcVar7;
            break;
          }
          iVar4 = strncmp(pcVar6,"type",4);
          if (iVar4 == 0) {
            desc = projections[mon->race->blow->effect->lash_type].lash_desc;
          }
          else {
            iVar4 = strncmp(pcVar6,"oftype",6);
            pcVar6 = pcVar7;
            if ((iVar4 != 0) ||
               (desc = projections[mon->race->blow->effect->lash_type].lash_desc,
               desc == (char *)0x0)) break;
            strnfcat(buf,0x400,&end," of ");
          }
        }
        strnfcat(buf,0x400,&end,"%s",desc);
        pcVar6 = pcVar7;
        break;
      }
      pcVar7 = pcVar7 + 1;
    }
    pcVar7 = strchr(pcVar6,0x7b);
    wVar10 = L'\x14';
  } while( true );
}

Assistant:

static void spell_message(struct monster *mon,
						  const struct monster_spell *spell,
						  bool seen, bool hits)
{
	const char punct[] = ".!?;:,'";
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;
	struct monster_spell_level *level = spell->level;
	struct monster *t_mon = NULL;
	bool is_leading;

	/* Get the right level of message */
	while (level->next && mon->race->spell_power >= level->next->power) {
		level = level->next;
	}

	/* Get the target monster, if any */
	if (mon->target.midx > 0) {
		t_mon = cave_monster(cave, mon->target.midx);
	}

	/* Get the message */
	if (!seen) {
		if (t_mon) {
			return;
		} else {
			in_cursor = find_alternate_spell_message(mon->race,
				spell->index, MON_ALTMSG_UNSEEN);
			if (in_cursor == NULL) {
				in_cursor = level->blind_message;
				if (in_cursor == NULL) {
					msg("No message-invis for monster "
						"spell %d cast by %s.  "
						"Please report this bug.",
						(int)spell->index,
						mon->race->name);
					return;
				}
			} else if (in_cursor[0] == '\0') {
				return;
			}
		}
	} else if (!hits) {
		in_cursor = find_alternate_spell_message(mon->race,
			spell->index, MON_ALTMSG_MISS);
		if (in_cursor == NULL) {
			in_cursor = level->miss_message;
			if (in_cursor == NULL) {
				msg("No message-miss for monster spell %d "
					"cast by %s.  Please report this bug.",
					(int)spell->index, mon->race->name);
				return;
			}
		} else if (in_cursor[0] == '\0') {
			return;
		}
	} else {
		in_cursor = find_alternate_spell_message(mon->race,
			spell->index, MON_ALTMSG_SEEN);
		if (in_cursor == NULL) {
			in_cursor = level->message;
			if (in_cursor == NULL) {
				msg("No message-vis for monster spell %d "
					"cast by %s.  Please report this bug.",
					(int)spell->index, mon->race->name);
				return;
			}
		} else if (in_cursor[0] == '\0') {
			return;
		}
	}

	next = strchr(in_cursor, '{');
	is_leading = (next == in_cursor);
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;

			switch (spell_tag_lookup(tag)) {
				case SPELL_TAG_NAME: {
					char m_name[80];
					int mdesc_mode = (MDESC_IND_HID |
						MDESC_PRO_HID);

					if (is_leading) {
						mdesc_mode |= MDESC_CAPITAL;
					}
					if (!strchr(punct, *in_cursor)) {
						mdesc_mode |= MDESC_COMMA;
					}
					monster_desc(m_name, sizeof(m_name),
						mon, mdesc_mode);

					strnfcat(buf, sizeof(buf), &end, "%s",
						m_name);
					break;
				}

				case SPELL_TAG_PRONOUN: {
					char m_poss[80];

					/* Get the monster possessive ("his"/"her"/"its") */
					monster_desc(m_poss, sizeof(m_poss), mon, MDESC_PRO_VIS | MDESC_POSS);

					strnfcat(buf, sizeof(buf), &end, "%s",
						m_poss);
					break;
				}

				case SPELL_TAG_TARGET: {
					char m_name[80];
					if (mon->target.midx > 0) {
						int mdesc_mode = MDESC_TARG;

						if (!strchr(punct, *in_cursor)) {
							mdesc_mode |= MDESC_COMMA;
						}
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							mdesc_mode);
						strnfcat(buf, sizeof(buf), &end,
							"%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "you");
					}
					break;
				}

				case SPELL_TAG_TYPE: {
					/* Get the attack type (assuming lash) */
					int type = mon->race->blow[0].effect->lash_type;
					char *type_name = projections[type].lash_desc;

					strnfcat(buf, sizeof(buf), &end, "%s",
						type_name);
					break;
				}

				case SPELL_TAG_OF_TYPE: {
					/* Get the attack type (assuming lash) */
					int type = mon->race->blow[0].effect->lash_type;
					char *type_name = projections[type].lash_desc;

					if (type_name) {
						strnfcat(buf, sizeof(buf), &end, " of ");
						strnfcat(buf, sizeof(buf), &end,
							"%s", type_name);
					}
					break;
				}

				default: {
					break;
				}
			}
		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
		is_leading = false;
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);

	msgt(spell->msgt, "%s", buf);
}